

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Coordinates(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAMFImporter_NodeElement *pCVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var8;
  runtime_error *this_00;
  bool bVar9;
  char *__end;
  float fVar10;
  string local_70;
  string local_50;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x60);
  pCVar3 = this->mNodeElement_Cur;
  pNode->Type = ENET_Coordinates;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode[1]._vptr_CAMFImporter_NodeElement = (_func_int **)0x0;
  pNode->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_00876ff0;
  pNode[1].Type = ENET_Color;
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar7 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar7 == '\0') {
      bVar9 = false;
      bVar4 = false;
      bVar5 = false;
    }
    else {
      paVar2 = &local_70.field_2;
      bVar5 = false;
      bVar4 = false;
      bVar9 = false;
      do {
        iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar7 == 1) {
          local_70._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"x","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar7 = std::__cxx11::string::compare((char *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (iVar7 == 0) {
            if (bVar9) {
              local_70._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"x","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this,&local_70,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
            }
            fVar10 = XML_ReadNode_GetVal_AsFloat(this);
            *(float *)&pNode[1]._vptr_CAMFImporter_NodeElement = fVar10;
            iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            cVar6 = (char)iVar7;
            bVar9 = true;
          }
          else {
            local_70._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"y","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar7 = std::__cxx11::string::compare((char *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (iVar7 == 0) {
              if (bVar4) {
                local_70._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"y","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_70,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
              }
              fVar10 = XML_ReadNode_GetVal_AsFloat(this);
              *(float *)((long)&pNode[1]._vptr_CAMFImporter_NodeElement + 4) = fVar10;
              iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              cVar6 = (char)iVar7;
              bVar4 = true;
            }
            else {
              local_70._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"z","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar7 = std::__cxx11::string::compare((char *)&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != paVar2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if (iVar7 != 0) {
                local_70._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,"coordinates","");
                XML_CheckNode_SkipUnsupported(this,&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                goto LAB_003c6c32;
              }
              if (bVar5) {
                local_70._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"z","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this,&local_70,&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
              }
              fVar10 = XML_ReadNode_GetVal_AsFloat(this);
              pNode[1].Type = (EType)fVar10;
              iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              cVar6 = (char)iVar7;
              bVar5 = true;
            }
          }
        }
        else {
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar7 == 2) {
            local_70._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"coordinates","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar7 = std::__cxx11::string::compare((char *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if (iVar7 == 0) goto LAB_003c6e7b;
          }
LAB_003c6c32:
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          cVar6 = (char)iVar7;
        }
      } while (cVar6 != '\0');
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"coordinates","");
    Throw_CloseNotFound(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
LAB_003c6e7b:
    ParseHelper_Node_Exit(this);
    if (((!bVar9) || (!bVar4)) || (!bVar5)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Not all coordinate\'s components are defined.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_70);
      *(undefined ***)this_00 = &PTR__runtime_error_00875f28;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void AMFImporter::ParseNode_Coordinates()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Coordinates(mNodeElement_Cur);

	CAMFImporter_NodeElement_Coordinates& als = *((CAMFImporter_NodeElement_Coordinates*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("coordinates");
			MACRO_NODECHECK_READCOMP_F("x", read_flag[0], als.Coordinate.x);
			MACRO_NODECHECK_READCOMP_F("y", read_flag[1], als.Coordinate.y);
			MACRO_NODECHECK_READCOMP_F("z", read_flag[2], als.Coordinate.z);
		MACRO_NODECHECK_LOOPEND("coordinates");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all coordinate's components are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}